

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O2

void __thiscall
FSoftwareRenderer::WriteSavePic
          (FSoftwareRenderer *this,player_t *player,FileWriter *file,int width,int height)

{
  uint32 *puVar1;
  DSimpleCanvas *this_00;
  PalEntry palette [256];
  
  this_00 = (DSimpleCanvas *)DObject::operator_new(0x50);
  DSimpleCanvas::DSimpleCanvas(this_00,width,height);
  puVar1 = &(this_00->super_DCanvas).super_DObject.ObjectFlags;
  *(byte *)puVar1 = (byte)*puVar1 | 8;
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[8])(this_00,1);
  swrenderer::R_RenderViewToCanvas
            (&player->mo->super_AActor,(DCanvas *)this_00,0,0,width,height,false);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1b])(screen,palette);
  M_CreatePNG(file,(this_00->super_DCanvas).Buffer,palette,SS_PAL,width,height,
              (this_00->super_DCanvas).Pitch);
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[9])(this_00);
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[4])(this_00);
  puVar1 = &(this_00->super_DCanvas).super_DObject.ObjectFlags;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[2])(this_00);
  return;
}

Assistant:

void FSoftwareRenderer::WriteSavePic (player_t *player, FileWriter *file, int width, int height)
{
	DCanvas *pic = new DSimpleCanvas (width, height);
	PalEntry palette[256];

	// Take a snapshot of the player's view
	pic->ObjectFlags |= OF_Fixed;
	pic->Lock ();
	R_RenderViewToCanvas (player->mo, pic, 0, 0, width, height);
	screen->GetFlashedPalette (palette);
	M_CreatePNG (file, pic->GetBuffer(), palette, SS_PAL, width, height, pic->GetPitch());
	pic->Unlock ();
	pic->Destroy();
	pic->ObjectFlags |= OF_YesReallyDelete;
	delete pic;
}